

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::Utils::VertexArray::Disable
               (Functions *gl,GLuint index,Type *type,GLuint n_array_elements)

{
  GLenum err;
  uint local_2c;
  uint local_28;
  GLuint column;
  GLuint element;
  GLuint n_array_elements_local;
  Type *type_local;
  GLuint index_local;
  Functions *gl_local;
  
  column = n_array_elements;
  if (n_array_elements == 0) {
    column = 1;
  }
  type_local._4_4_ = index;
  for (local_28 = 0; local_28 < column; local_28 = local_28 + 1) {
    for (local_2c = 1; local_2c <= type->m_n_columns; local_2c = local_2c + 1) {
      (*gl->disableVertexAttribArray)(type_local._4_4_);
      err = (*gl->getError)();
      glu::checkError(err,"DisableVertexAttribArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,0xe51);
      type_local._4_4_ = type_local._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void VertexArray::Disable(const Functions& gl, GLuint index, const Type& type, GLuint n_array_elements)
{
	/* If attribute is not an array */
	if (0 == n_array_elements)
	{
		n_array_elements = 1;
	}

	/* For each element in array */
	for (GLuint element = 0; element < n_array_elements; ++element)
	{
		/* For each column in matrix */
		for (GLuint column = 1; column <= type.m_n_columns; ++column)
		{
			/* Enable attribute array */
			gl.disableVertexAttribArray(index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "DisableVertexAttribArray");

			/* Next location */
			index += 1;
		}
	}
}